

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void select_colors(j_decompress_ptr cinfo,int desired_colors)

{
  int iVar1;
  boxptr boxp;
  int local_28;
  int i;
  int numboxes;
  boxptr boxlist;
  int desired_colors_local;
  j_decompress_ptr cinfo_local;
  
  boxp = (boxptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)desired_colors * 0x28);
  boxp->c0min = 0;
  boxp->c0max = 0x1f;
  boxp->c1min = 0;
  boxp->c1max = 0x3f;
  boxp->c2min = 0;
  boxp->c2max = 0x1f;
  update_box(cinfo,boxp);
  iVar1 = median_cut(cinfo,boxp,1,desired_colors);
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    compute_color(cinfo,boxp + local_28,local_28);
  }
  cinfo->actual_number_of_colors = iVar1;
  cinfo->err->msg_code = 0x62;
  (cinfo->err->msg_parm).i[0] = iVar1;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  return;
}

Assistant:

LOCAL(void)
select_colors (j_decompress_ptr cinfo, int desired_colors)
/* Master routine for color selection */
{
  boxptr boxlist;
  int numboxes;
  int i;

  /* Allocate workspace for box list */
  boxlist = (boxptr) (*cinfo->mem->alloc_small)
    ((j_common_ptr) cinfo, JPOOL_IMAGE, desired_colors * SIZEOF(box));
  /* Initialize one box containing whole space */
  numboxes = 1;
  boxlist[0].c0min = 0;
  boxlist[0].c0max = MAXJSAMPLE >> C0_SHIFT;
  boxlist[0].c1min = 0;
  boxlist[0].c1max = MAXJSAMPLE >> C1_SHIFT;
  boxlist[0].c2min = 0;
  boxlist[0].c2max = MAXJSAMPLE >> C2_SHIFT;
  /* Shrink it to actually-used volume and set its statistics */
  update_box(cinfo, & boxlist[0]);
  /* Perform median-cut to produce final box list */
  numboxes = median_cut(cinfo, boxlist, numboxes, desired_colors);
  /* Compute the representative color for each box, fill colormap */
  for (i = 0; i < numboxes; i++)
    compute_color(cinfo, & boxlist[i], i);
  cinfo->actual_number_of_colors = numboxes;
  TRACEMS1(cinfo, 1, JTRC_QUANT_SELECTED, numboxes);
}